

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

void VaxpyVectorArray_Serial(int nvec,sunrealtype a,N_Vector *X,N_Vector *Y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  lVar1 = *(*X)->content;
  if ((a != 1.0) || (NAN(a))) {
    if ((a != -1.0) || (NAN(a))) {
      if (0 < nvec) {
        uVar4 = 0;
        do {
          if (0 < lVar1) {
            lVar2 = *(long *)((long)X[uVar4]->content + 0x10);
            lVar3 = *(long *)((long)Y[uVar4]->content + 0x10);
            lVar5 = 0;
            do {
              *(double *)(lVar3 + lVar5 * 8) =
                   *(double *)(lVar2 + lVar5 * 8) * a + *(double *)(lVar3 + lVar5 * 8);
              lVar5 = lVar5 + 1;
            } while (lVar1 != lVar5);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)nvec);
      }
    }
    else if (0 < nvec) {
      uVar4 = 0;
      do {
        if (0 < lVar1) {
          lVar2 = *(long *)((long)X[uVar4]->content + 0x10);
          lVar3 = *(long *)((long)Y[uVar4]->content + 0x10);
          lVar5 = 0;
          do {
            *(double *)(lVar3 + lVar5 * 8) =
                 *(double *)(lVar3 + lVar5 * 8) - *(double *)(lVar2 + lVar5 * 8);
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)nvec);
    }
  }
  else if (0 < nvec) {
    uVar4 = 0;
    do {
      if (0 < lVar1) {
        lVar2 = *(long *)((long)X[uVar4]->content + 0x10);
        lVar3 = *(long *)((long)Y[uVar4]->content + 0x10);
        lVar5 = 0;
        do {
          *(double *)(lVar3 + lVar5 * 8) =
               *(double *)(lVar2 + lVar5 * 8) + *(double *)(lVar3 + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nvec);
  }
  return;
}

Assistant:

static void VaxpyVectorArray_Serial(int nvec, sunrealtype a, N_Vector* X,
                                    N_Vector* Y)
{
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;

  N = NV_LENGTH_S(X[0]);

  if (a == ONE)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] += xd[j]; }
    }
    return;
  }

  if (a == -ONE)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      yd = NV_DATA_S(Y[i]);
      for (j = 0; j < N; j++) { yd[j] -= xd[j]; }
    }
    return;
  }

  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    for (j = 0; j < N; j++) { yd[j] += a * xd[j]; }
  }
}